

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O1

char * serialize_ru124_(char *r,char *w,uint32_t *pv)

{
  uint32_t uVar1;
  char *pcVar2;
  
  if (*pv == 0xff) {
    pcVar2 = r + 4;
    if (w < pcVar2) {
      return (char *)0x0;
    }
    uVar1 = *(uint32_t *)r;
  }
  else {
    if (w <= r) {
      return (char *)0x0;
    }
    uVar1 = (uint)(byte)*r + (*pv & 0x1f) * 0x100 + 0xe0;
    pcVar2 = r + 1;
  }
  *pv = uVar1;
  return pcVar2;
}

Assistant:

static LJ_NOINLINE char *serialize_ru124_(char *r, char *w, uint32_t *pv)
{
  uint32_t v = *pv;
  if (v != 0xff) {
    if (r >= w) return NULL;
    v = ((v & 0x1f) << 8) + *(uint8_t *)r + 0xe0; r++;
  } else {
    if (r + 4 > w) return NULL;
    v = lj_getu32(r); r += 4;
#if LJ_BE
    v = lj_bswap(v);
#endif
  }
  *pv = v;
  return r;
}